

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_2;
  NetTypeDeclarationSyntax *pNVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  WithFunctionClauseSyntax *local_40;
  Token local_38;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_38,
                      (BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x78) == (SyntaxNode *)0x0) {
    local_40 = (WithFunctionClauseSyntax *)0x0;
  }
  else {
    local_40 = (WithFunctionClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x78),(DeepCloneVisitor *)&local_50,
                          (BumpAllocator *)__child_stack);
  }
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x80),(BumpAllocator *)__child_stack);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NetTypeDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::parsing::Token,slang::syntax::WithFunctionClauseSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_60,(DataTypeSyntax *)args_2,
                      &local_38,&local_40,&local_50);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NetTypeDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NetTypeDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        node.name.deepClone(alloc),
        node.withFunction ? deepClone(*node.withFunction, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}